

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

int __thiscall
CVmObjLookupTable::getp_remove_entry
          (CVmObjLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  char *pcVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  int iVar4;
  vm_lookup_val *pvVar5;
  vm_lookup_val *pvVar6;
  CVmObjLookupTable *this_00;
  uint hashval;
  vm_lookup_val *prv_entry;
  vm_val_t key;
  uint local_44;
  vm_lookup_val *local_40;
  vm_val_t local_38;
  
  if (getp_remove_entry(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_remove_entry();
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,argc,&getp_remove_entry::desc);
  if (iVar4 == 0) {
    local_38.typ = sp_[-1].typ;
    local_38._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
    local_38.val = sp_[-1].val;
    this_00 = this;
    sp_ = sp_ + -1;
    pvVar5 = find_entry(this,&local_38,&local_44,&local_40);
    if (pvVar5 == (vm_lookup_val *)0x0) {
      retval->typ = VM_NIL;
    }
    else {
      uVar3 = *(undefined4 *)&(pvVar5->val).field_0x4;
      aVar2 = (pvVar5->val).val;
      retval->typ = (pvVar5->val).typ;
      *(undefined4 *)&retval->field_0x4 = uVar3;
      retval->val = aVar2;
      add_undo_rec(this_00,self,LOOKUPTAB_UNDO_DEL,&local_38,retval);
      pcVar1 = (this->super_CVmObjCollection).super_CVmObject.ext_;
      pvVar6 = (vm_lookup_val *)(pcVar1 + (ulong)local_44 * 8);
      if (local_40 != (vm_lookup_val *)0x0) {
        pvVar6 = local_40;
      }
      pvVar6->nxt = pvVar5->nxt;
      pvVar5->nxt = *(vm_lookup_val **)(pcVar1 + 8);
      *(vm_lookup_val **)(pcVar1 + 8) = pvVar5;
      (pvVar5->key).typ = VM_EMPTY;
      (pvVar5->val).typ = VM_EMPTY;
    }
  }
  return 1;
}

Assistant:

int CVmObjLookupTable::getp_remove_entry(VMG_ vm_obj_id_t self,
                                         vm_val_t *retval, uint *argc)
{
    vm_lookup_val *entry;
    vm_val_t key;
    uint hashval;
    vm_lookup_val *prv_entry;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the key */
    G_stk->pop(&key);

    /* find the entry for this key */
    entry = find_entry(vmg_ &key, &hashval, &prv_entry);

    /* if we found the entry, delete it */
    if (entry != 0)
    {
        /* the return value is the value stored at this key */
        *retval = entry->val;

        /* generate undo for the change */
        add_undo_rec(vmg_ self, LOOKUPTAB_UNDO_DEL, &key, retval);

        /* unlink the entry */
        unlink_entry(vmg_ entry, hashval, prv_entry);
    }
    else
    {
        /* not found - the return value is nil */
        retval->set_nil();
    }

    /* handled */
    return TRUE;
}